

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall File::save(File *this,string *fileName)

{
  byte bVar1;
  undefined8 uVar2;
  ostream *poVar3;
  ulong uVar4;
  TagVector *pTVar5;
  size_type sVar6;
  reference ppTVar7;
  string local_3e0 [36];
  uint local_3bc;
  stringstream local_3b8 [4];
  uint i;
  stringstream stream;
  long local_220;
  ofstream file;
  bool local_19;
  bool success;
  string *fileName_local;
  File *this_local;
  
  uVar2 = std::__cxx11::string::c_str();
  std::ofstream::ofstream(&local_220,uVar2,0x10);
  bVar1 = std::ios::operator!((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  local_19 = (bVar1 & 1) != 0;
  if (local_19) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Error: Can\'t create file \"");
    poVar3 = std::operator<<(poVar3,(string *)fileName);
    poVar3 = std::operator<<(poVar3,"\"!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  local_19 = !local_19;
  std::__cxx11::stringstream::stringstream(local_3b8);
  local_3bc = 0;
  while( true ) {
    uVar4 = (ulong)local_3bc;
    pTVar5 = elements(this);
    sVar6 = std::vector<Tag_*,_std::allocator<Tag_*>_>::size(pTVar5);
    if (sVar6 <= uVar4) break;
    pTVar5 = elements(this);
    ppTVar7 = std::vector<Tag_*,_std::allocator<Tag_*>_>::operator[](pTVar5,(ulong)local_3bc);
    (**((*ppTVar7)->super_StreamObject)._vptr_StreamObject)(*ppTVar7,local_3b8);
    local_3bc = local_3bc + 1;
  }
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)&local_220,local_3e0);
  std::__cxx11::string::~string(local_3e0);
  std::ofstream::close();
  std::__cxx11::stringstream::~stringstream(local_3b8);
  std::ofstream::~ofstream(&local_220);
  return local_19;
}

Assistant:

bool File::save( std::string fileName )
{
	bool success = true;

	std::ofstream file( fileName.c_str() );

	if ( !file )
	{
                std::cerr << "Error: Can't create file \"" << fileName << "\"!" << std::endl;
		success = false;
	}

	std::stringstream stream;

	for ( unsigned int i = 0; i < elements().size(); i++ )
	{
		elements()[i]->write( stream );
	}

	file << stream.str();

	file.close();

	return success;
}